

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NinjaCommand.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_6b36e::ParseCommandActions::actOnDefaultDecl
          (ParseCommandActions *this,ArrayRef<llbuild::ninja::Token> names)

{
  bool bVar1;
  ostream *poVar2;
  Token *name;
  Token *token;
  long lVar3;
  string local_50;
  
  token = names.Data;
  poVar2 = std::operator<<((ostream *)&std::cerr,"actOnDefaultDecl");
  std::operator<<(poVar2,"(/*Names=*/[");
  bVar1 = true;
  for (lVar3 = names.Length * 0x18; lVar3 != 0; lVar3 = lVar3 + -0x18) {
    if (!bVar1) {
      std::operator<<((ostream *)&std::cerr,", ");
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"\"");
    escapedString_abi_cxx11_(&local_50,token);
    poVar2 = std::operator<<(poVar2,(string *)&local_50);
    std::operator<<(poVar2,"\"");
    std::__cxx11::string::_M_dispose();
    token = token + 1;
    bVar1 = false;
  }
  std::operator<<((ostream *)&std::cerr,"])\n");
  return;
}

Assistant:

virtual void actOnDefaultDecl(ArrayRef<ninja::Token> names) override {
    std::cerr << __FUNCTION__ << "(/*Names=*/[";
    bool first = true;
    for (auto& name: names) {
      if (!first)
        std::cerr << ", ";
      std::cerr << "\"" << escapedString(name) << "\"";
      first = false;
    }
    std::cerr << "])\n";
  }